

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-use.c
# Opt level: O0

_Bool borg_activate_ring(int ring_sval)

{
  borg_item_conflict *pbVar1;
  char *what;
  borg_item_conflict *item;
  int i;
  int ring_sval_local;
  
  item._4_4_ = z_info->pack_size + 2;
  while( true ) {
    if ((int)(z_info->pack_size + 3) <= item._4_4_) {
      return false;
    }
    pbVar1 = borg_items + item._4_4_;
    if (((((pbVar1->aware & 1U) != 0) && (pbVar1->tval == '\x15')) &&
        ((uint)pbVar1->sval == ring_sval)) &&
       ((pbVar1->timeout == 0 && ((pbVar1->ident & 1U) != 0)))) break;
    item._4_4_ = item._4_4_ + 1;
  }
  what = format("# Activating ring %s.",pbVar1);
  borg_note(what);
  borg_keypress(0x41);
  borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                     [(int)(item._4_4_ - (uint)z_info->pack_size)]);
  return true;
}

Assistant:

bool borg_activate_ring(int ring_sval)
{
    int i;

    /* Check the equipment */
    for (i = INVEN_RIGHT; i < INVEN_LEFT; i++) {
        borg_item *item = &borg_items[i];

        /*  Make Sure item is IDed */
        if (!item->aware)
            continue;

        /* Skip incorrect mails */
        if (item->tval != TV_RING)
            continue;
        if (item->sval != ring_sval)
            continue;

        /* Check charge */
        if (item->timeout)
            continue;

        /*  Make Sure item is IDed */
        if (!item->ident)
            continue;

        /* Log the message */
        borg_note(format("# Activating ring %s.", item->desc));

        /* Perform the action */
        borg_keypress('A');
        borg_keypress(all_letters_nohjkl[i - INVEN_WIELD]);

        /* Success */
        return true;
    }

    return false;
}